

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VANAnalyzer.cpp
# Opt level: O0

void __thiscall VanAnalyzer::SetupResults(VanAnalyzer *this)

{
  VanAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  VanAnalyzer *this_local;
  
  this_00 = (VanAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<VanAnalyzerSettings>::get(&this->mSettings);
  VanAnalyzerResults::VanAnalyzerResults(this_00,this,settings);
  std::auto_ptr<VanAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<VanAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<VanAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<VanAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void VanAnalyzer::SetupResults()
{
    mResults.reset( new VanAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}